

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::QueueCommand<swrenderer::FillColumnSubClampPalCommand>(void)

{
  DrawerCommandQueue *this;
  FillColumnSubClampPalCommand *this_00;
  FillColumnSubClampPalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    command.super_PalColumnCommand._destblend = (uint32_t *)0x0;
    command.super_PalColumnCommand._srccolor = 0;
    command.super_PalColumnCommand._92_4_ = 0;
    command.super_PalColumnCommand._color = 0;
    command.super_PalColumnCommand._68_4_ = 0;
    command.super_PalColumnCommand._srcblend = (uint32_t *)0x0;
    command.super_PalColumnCommand._source = (uint8_t *)0x0;
    command.super_PalColumnCommand._translation = (uint8_t *)0x0;
    command.super_PalColumnCommand._texturefrac = 0;
    command.super_PalColumnCommand._36_4_ = 0;
    command.super_PalColumnCommand._colormap = (uint8_t *)0x0;
    command.super_PalColumnCommand._dest = (uint8_t *)0x0;
    command.super_PalColumnCommand._pitch = 0;
    command.super_PalColumnCommand._iscale = 0;
    command.super_PalColumnCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    command.super_PalColumnCommand.super_DrawerCommand._dest_y = 0;
    command.super_PalColumnCommand.super_DrawerCommand._12_4_ = 0;
    swrenderer::FillColumnSubClampPalCommand::FillColumnSubClampPalCommand(&command);
    VectoredTryCatch(&command,QueueCommand<swrenderer::FillColumnSubClampPalCommand>::
                              anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::FillColumnSubClampPalCommand>::anon_class_1_0_00000001
                     ::__invoke);
  }
  else {
    this_00 = (FillColumnSubClampPalCommand *)AllocMemory(0x60);
    if (this_00 == (FillColumnSubClampPalCommand *)0x0) {
      Finish(this);
      this_00 = (FillColumnSubClampPalCommand *)AllocMemory(0x60);
      if (this_00 == (FillColumnSubClampPalCommand *)0x0) {
        return;
      }
    }
    (this_00->super_PalColumnCommand)._destblend = (uint32_t *)0x0;
    *(undefined8 *)&(this_00->super_PalColumnCommand)._srccolor = 0;
    *(undefined8 *)&(this_00->super_PalColumnCommand)._color = 0;
    (this_00->super_PalColumnCommand)._srcblend = (uint32_t *)0x0;
    (this_00->super_PalColumnCommand)._source = (uint8_t *)0x0;
    (this_00->super_PalColumnCommand)._translation = (uint8_t *)0x0;
    *(undefined8 *)&(this_00->super_PalColumnCommand)._texturefrac = 0;
    (this_00->super_PalColumnCommand)._colormap = (uint8_t *)0x0;
    (this_00->super_PalColumnCommand)._dest = (uint8_t *)0x0;
    (this_00->super_PalColumnCommand)._pitch = 0;
    (this_00->super_PalColumnCommand)._iscale = 0;
    (this_00->super_PalColumnCommand).super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_PalColumnCommand).super_DrawerCommand._dest_y = 0;
    swrenderer::FillColumnSubClampPalCommand::FillColumnSubClampPalCommand(this_00);
    command.super_PalColumnCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&command);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}